

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::MarkArgumentsUsedForBranch(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *pOVar2;
  _func_int *p_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  ArgSlot AVar7;
  undefined4 *puVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  Opnd *this_00;
  
  if (instr->m_kind != InstrKindBranch) {
    return;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < ADD) {
    if (OVar1 == Br) {
      return;
    }
    if (OVar1 == MultiBr) {
      return;
    }
  }
  else {
    bVar5 = LowererMD::IsUnconditionalBranch(instr);
    if (bVar5) {
      return;
    }
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar5) goto LAB_00443237;
      *puVar8 = 0;
    }
  }
  pOVar2 = instr->m_src1;
  this_00 = instr->m_src2;
  if (this_00 == (Opnd *)0x0) {
    if ((instr->m_opcode & ~ExtendedOpcodePrefix) != BrFalse_A) {
      return;
    }
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindReg) {
      return;
    }
LAB_004430d4:
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00443237;
      *puVar8 = 0;
    }
    this_00 = pOVar2;
    if (pOVar2 == (Opnd *)0x0) {
      return;
    }
  }
  else {
    OVar6 = IR::Opnd::GetKind(this_00);
    if (((((OVar6 == OpndKindIntConst) ||
          (OVar6 = IR::Opnd::GetKind(this_00), OVar6 == OpndKindInt64Const)) ||
         (OVar6 = IR::Opnd::GetKind(this_00), OVar6 == OpndKindAddr)) ||
        (((OVar6 = IR::Opnd::GetKind(this_00), OVar6 == OpndKindHelperCall ||
          (OVar6 = IR::Opnd::GetKind(this_00), OVar6 == OpndKindFloatConst)) ||
         (OVar6 = IR::Opnd::GetKind(this_00), OVar6 == OpndKindSimd128Const)))) &&
       (OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 == OpndKindReg)) goto LAB_004430d4;
    OVar6 = IR::Opnd::GetKind(this_00);
    if (OVar6 != OpndKindReg) {
      return;
    }
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (((OVar6 != OpndKindIntConst) &&
        (OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 != OpndKindInt64Const)) &&
       ((OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 != OpndKindAddr &&
        (((OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 != OpndKindHelperCall &&
          (OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 != OpndKindFloatConst)) &&
         (OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 != OpndKindSimd128Const)))))) {
      return;
    }
    OVar6 = IR::Opnd::GetKind(this_00);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00443237;
      *puVar8 = 0;
    }
  }
  p_Var3 = this_00[1]._vptr_Opnd[5];
  if ((((p_Var3 != (_func_int *)0x0 & *(byte *)(this_00[1]._vptr_Opnd + 3)) == 1) &&
      (pOVar2 = *(Opnd **)(p_Var3 + 0x48), pOVar2 != (Opnd *)0x0)) &&
     (OVar6 = IR::Opnd::GetKind(pOVar2), OVar6 == OpndKindSym)) {
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) {
LAB_00443237:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    if (*(char *)((long)pOVar2[1]._vptr_Opnd + 0x14) == '\x01') {
      pSVar9 = IR::Opnd::AsSymOpnd(pOVar2);
      pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
      if ((pSVar10->field_0x1a & 0x40) != 0) {
        pSVar9 = IR::Opnd::AsSymOpnd(pOVar2);
        pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
        AVar7 = StackSym::GetParamSlotNum(pSVar10);
        if (AVar7 < 0xd) {
          JITOutput::SetArgUsedForBranch(&this->func->m_output,(uint8)AVar7);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::MarkArgumentsUsedForBranch(IR::Instr * instr)
{
    // If it's a conditional branch instruction and the operand used for branching is one of the arguments
    // to the function, tag the m_argUsedForBranch of the functionBody so that it can be used later for inlining decisions.
    if (instr->IsBranchInstr() && !instr->AsBranchInstr()->IsUnconditional())
    {
        IR::BranchInstr * bInstr = instr->AsBranchInstr();
        IR::Opnd *src1 = bInstr->GetSrc1();
        IR::Opnd *src2 = bInstr->GetSrc2();
        // These are used because we don't want to rely on src1 or src2 to always be the register/constant
        IR::RegOpnd *regOpnd = nullptr;
        if (!src2 && (instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A) && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        // We need to check for (0===arg) and (arg===0); this is especially important since some minifiers
        // change all instances of one to the other.
        else if (src2 && src2->IsConstOpnd() && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        else if (src2 && src2->IsRegOpnd() && src1->IsConstOpnd())
        {
            regOpnd = src2->AsRegOpnd();
        }
        if (regOpnd != nullptr)
        {
            if (regOpnd->m_sym->IsSingleDef())
            {
                IR::Instr * defInst = regOpnd->m_sym->GetInstrDef();
                IR::Opnd *defSym = defInst->GetSrc1();
                if (defSym && defSym->IsSymOpnd() && defSym->AsSymOpnd()->m_sym->IsStackSym()
                    && defSym->AsSymOpnd()->m_sym->AsStackSym()->IsParamSlotSym())
                {
                    uint16 param = defSym->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

                    // We only support functions with 13 arguments to ensure optimal size of callSiteInfo
                    if (param < Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                    {
                        this->func->GetJITOutput()->SetArgUsedForBranch((uint8)param);
                    }
                }
            }
        }
    }
}